

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
StringInstance::op_insert_beforeIndex
          (StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  undefined8 *puVar5;
  StringInstance *this_00;
  string *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  int index;
  StringInstance *in_stack_fffffffffffffe98;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  allocator local_125 [13];
  string *in_stack_fffffffffffffee8;
  IntegerInstance *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff38;
  StringInstance *in_stack_ffffffffffffff40;
  string local_a0 [32];
  IntegerInstance local_80;
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar4 != 2) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_string_value
                    ((string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (!bVar1) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,1);
  IntegerInstance::IntegerInstance(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  iVar2 = IntegerInstance::value(&local_80);
  IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bd7d7);
  local_1c = iVar2;
  if (-1 < iVar2) {
    iVar3 = std::__cxx11::string::size();
    if (iVar2 <= iVar3) {
      this_00 = (StringInstance *)(in_RSI + 0x58);
      psVar6 = (string *)(long)local_1c;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_18,0);
      StringInstance(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      value_abi_cxx11_(in_stack_fffffffffffffe98);
      std::__cxx11::string::insert((ulong)this_00,psVar6);
      std::__cxx11::string::~string(local_a0);
      ~StringInstance(this_00);
      paVar7 = local_125;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"null",paVar7);
      std::allocator<char>::~allocator((allocator<char> *)local_125);
      return in_RDI;
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_insert_beforeIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_string_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    int index = IntegerInstance(arguments[1]).value();
    if (index < 0 || index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    _value.insert(index, StringInstance(arguments[0]).value());
    return "null";
}